

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void writeBits(LodePNGBitWriter *writer,uint value,size_t nbits)

{
  byte *pbVar1;
  uint uVar2;
  byte bVar3;
  size_t i;
  size_t sVar4;
  
  if (nbits == 1) {
    bVar3 = writer->bp & 7;
    if (bVar3 == 0) {
      uVar2 = ucvector_resize(writer->data,writer->data->size + 1);
      if (uVar2 == 0) {
        return;
      }
      writer->data->data[writer->data->size - 1] = '\0';
      bVar3 = writer->bp & 7;
    }
    pbVar1 = writer->data->data + (writer->data->size - 1);
    *pbVar1 = *pbVar1 | (byte)(value << bVar3);
    writer->bp = writer->bp + '\x01';
  }
  else {
    for (sVar4 = 0; nbits != sVar4; sVar4 = sVar4 + 1) {
      bVar3 = writer->bp & 7;
      if (bVar3 == 0) {
        uVar2 = ucvector_resize(writer->data,writer->data->size + 1);
        if (uVar2 == 0) {
          return;
        }
        writer->data->data[writer->data->size - 1] = '\0';
        bVar3 = writer->bp & 7;
      }
      pbVar1 = writer->data->data + (writer->data->size - 1);
      *pbVar1 = *pbVar1 | ((value >> ((uint)sVar4 & 0x1f) & 1) != 0) << bVar3;
      writer->bp = writer->bp + '\x01';
    }
  }
  return;
}

Assistant:

static void writeBits(LodePNGBitWriter* writer, unsigned value, size_t nbits) {
  if(nbits == 1) { /* compiler should statically compile this case if nbits == 1 */
    WRITEBIT(writer, value);
  } else {
    /* TODO: increase output size only once here rather than in each WRITEBIT */
    size_t i;
    for(i = 0; i != nbits; ++i) {
      WRITEBIT(writer, (unsigned char)((value >> i) & 1));
    }
  }
}